

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void decompressBlockAlphaC(uint8 *data,uint8 *img,int width,int height,int ix,int iy,int channels)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint8 uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  char cVar12;
  int iVar13;
  
  bVar1 = *data;
  bVar2 = data[1];
  iVar13 = 2;
  iVar4 = 0;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      uVar9 = 0;
      cVar12 = '\x05';
      for (iVar7 = -5; iVar7 != -8; iVar7 = iVar7 + -1) {
        iVar11 = iVar4 + 1;
        if (6 < iVar4) {
          iVar11 = 0;
        }
        uVar8 = 1 << ((byte)-(iVar4 + -7) & 0x1f) & (uint)data[iVar13];
        uVar3 = uVar8 << ((char)iVar4 + (char)iVar7 & 0x1fU);
        if (iVar7 + 7 < -(iVar4 + -7)) {
          uVar3 = uVar8 >> (cVar12 - (char)iVar4 & 0x1fU);
        }
        uVar9 = uVar9 | uVar3 & 0xff;
        iVar13 = iVar13 + (uint)(6 < iVar4);
        cVar12 = cVar12 + '\x01';
        iVar4 = iVar11;
      }
      iVar7 = alphaTable[bVar2][uVar9] + (uint)bVar1;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar5 = (uint8)iVar7;
      if (0xfe < iVar7) {
        uVar5 = 0xff;
      }
      img[((iy + lVar10) * (long)width + ix + lVar6) * (long)channels] = uVar5;
    }
  }
  return;
}

Assistant:

void decompressBlockAlphaC(uint8* data, uint8* img, int width, int height, int ix, int iy, int channels) 
{
	int alpha = data[0];
	int table = data[1];
	
	int bit=0;
	int byte=2;
	//extract an alpha value for each pixel.
	for(int x=0; x<4; x++) 
	{
		for(int y=0; y<4; y++) 
		{
			//Extract table index
			int index=0;
			for(int bitpos=0; bitpos<3; bitpos++) 
			{
				index|=getbit(data[byte],7-bit,2-bitpos);
				bit++;
				if(bit>7) 
				{
					bit=0;
					byte++;
				}
			}
			img[(ix+x+(iy+y)*width)*channels]=clamp(alpha +alphaTable[table][index]);
		}
	}
}